

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O1

int __thiscall Map_Chest::AddItem(Map_Chest *this,short item_id,int amount,int slot)

{
  size_t *psVar1;
  list<Map_Chest_Item,_std::allocator<Map_Chest_Item>_> *plVar2;
  short sVar3;
  _List_node_base *p_Var4;
  int iVar5;
  int iVar6;
  Map_Chest_Item chestitem;
  value_type local_24;
  
  if (amount < 1) {
    return 0;
  }
  if (slot == 0) {
    plVar2 = &this->items;
    p_Var4 = (_List_node_base *)plVar2;
    iVar5 = amount;
    do {
      p_Var4 = (((_List_base<Map_Chest_Item,_std::allocator<Map_Chest_Item>_> *)&p_Var4->_M_next)->
               _M_impl)._M_node.super__List_node_base._M_next;
      if (p_Var4 == (_List_node_base *)plVar2) break;
      sVar3 = *(short *)&p_Var4[1]._M_next;
      if (sVar3 == item_id) {
        iVar6 = *(int *)((long)&p_Var4[1]._M_next + 4) + amount;
        iVar5 = 0;
        if ((-1 < iVar6) && (iVar5 = 0, iVar6 <= this->maxchest)) {
          *(int *)((long)&p_Var4[1]._M_next + 4) = iVar6;
          iVar5 = amount;
        }
      }
    } while (sVar3 != item_id);
    if (p_Var4 != (_List_node_base *)plVar2) {
      return iVar5;
    }
  }
  if ((this->items).super__List_base<Map_Chest_Item,_std::allocator<Map_Chest_Item>_>._M_impl.
      _M_node._M_size < (ulong)(long)this->chestslots) {
    iVar5 = 0;
    if (amount <= this->maxchest) {
      local_24.id = item_id;
      local_24.amount = amount;
      local_24.slot = slot;
      if (slot == 0) {
        plVar2 = &this->items;
        p_Var4 = (plVar2->super__List_base<Map_Chest_Item,_std::allocator<Map_Chest_Item>_>)._M_impl
                 ._M_node.super__List_node_base._M_next;
        iVar6 = 0;
        if (p_Var4 != (_List_node_base *)plVar2) {
          iVar6 = 0;
          do {
            iVar6 = iVar6 + (uint)(*(int *)&p_Var4[1]._M_prev == 0);
            p_Var4 = p_Var4->_M_next;
          } while (p_Var4 != (_List_node_base *)plVar2);
        }
        iVar5 = 0;
        if (iVar6 + this->slots < this->chestslots) {
          std::__cxx11::list<Map_Chest_Item,_std::allocator<Map_Chest_Item>_>::push_back
                    (plVar2,&local_24);
          iVar5 = amount;
        }
      }
      else {
        p_Var4 = (_List_node_base *)operator_new(0x20);
        p_Var4[1]._M_next =
             (_List_node_base *)CONCAT44(local_24.amount,CONCAT22(local_24._2_2_,local_24.id));
        *(int *)&p_Var4[1]._M_prev = local_24.slot;
        std::__detail::_List_node_base::_M_hook(p_Var4);
        psVar1 = &(this->items).super__List_base<Map_Chest_Item,_std::allocator<Map_Chest_Item>_>.
                  _M_impl._M_node._M_size;
        *psVar1 = *psVar1 + 1;
        iVar5 = amount;
      }
    }
  }
  else {
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

int Map_Chest::AddItem(short item_id, int amount, int slot)
{
	if (amount <= 0)
	{
		return 0;
	}

	if (slot == 0)
	{
		UTIL_FOREACH_REF(this->items, item)
		{
			if (item.id == item_id)
			{
				if (item.amount + amount < 0 || item.amount + amount > this->maxchest)
				{
					return 0;
				}

				item.amount += amount;
				return amount;
			}
		}
	}

	if (this->items.size() >= static_cast<std::size_t>(this->chestslots) || amount > this->maxchest)
	{
		return 0;
	}

	if (slot == 0)
	{
		int user_items = 0;

		UTIL_FOREACH(this->items, item)
		{
			if (item.slot == 0)
			{
				++user_items;
			}
		}

		if (user_items + this->slots >= this->chestslots)
		{
			return 0;
		}
	}

	Map_Chest_Item chestitem;
	chestitem.id = item_id;
	chestitem.amount = amount;
	chestitem.slot = slot;

	if (slot == 0)
	{
		this->items.push_back(chestitem);
	}
	else
	{
		this->items.push_front(chestitem);
	}

	return amount;
}